

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

Expression * __thiscall
wasm::TranslateToFuzzReader::makeStringNewCodePoint(TranslateToFuzzReader *this)

{
  Expression *ref;
  StringNew *pSVar1;
  
  ref = make(this,(Type)0x2);
  pSVar1 = Builder::makeStringNew
                     (&this->builder,StringNewFromCodePoint,ref,(Expression *)0x0,(Expression *)0x0)
  ;
  return (Expression *)pSVar1;
}

Assistant:

Expression* TranslateToFuzzReader::makeStringNewCodePoint() {
  auto codePoint = make(Type::i32);
  return builder.makeStringNew(StringNewFromCodePoint, codePoint);
}